

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O2

bool __thiscall Lib::Set<Kernel::Clause_*,_Lib::DefaultHash>::Iterator::hasNext(Iterator *this)

{
  Cell *pCVar1;
  
  pCVar1 = this->_next;
  while ((pCVar1 != this->_last && (pCVar1->code < 2))) {
    pCVar1 = pCVar1 + 1;
    this->_next = pCVar1;
  }
  return pCVar1 != this->_last;
}

Assistant:

bool hasNext()
    {
      while (_next != _last) {
	if (_next->occupied()) {
	  return true;
	}
	_next++;
      }
      return false;
    }